

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O2

void garray_arrayviewlist_fillpage(_garray *x,t_float fPage,t_float fTopItem)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int size;
  t_word *data;
  int local_34;
  t_word *local_30;
  
  local_34 = 0;
  local_30 = (t_word *)0x0;
  iVar2 = garray_getfloatwords(x,&local_34,&local_30);
  iVar1 = local_34;
  if (iVar2 != 0) {
    uVar3 = (local_34 + -1) / 1000;
    uVar4 = (int)fPage;
    if ((int)uVar3 < (int)fPage) {
      uVar4 = uVar3;
    }
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = 0;
    }
    pdgui_vmess("::dialog_array::listview_setpage","s iii",x->x_realname->s_name,uVar5,
                (ulong)(uVar3 + 1),1000);
    uVar3 = (int)uVar5 * 1000;
    uVar4 = iVar1 + (int)uVar5 * -1000;
    if ((int)(uVar3 + 1000) <= iVar1) {
      uVar4 = 1000;
    }
    pdgui_vmess("::dialog_array::listview_setdata","siw",x->x_realname->s_name,(ulong)uVar3,
                (ulong)uVar4,local_30 + uVar3);
    pdgui_vmess("::dialog_array::listview_focus","si",x->x_realname->s_name,
                (ulong)(uint)(int)fTopItem);
    return;
  }
  pd_error(x,"error in %s()","garray_arrayviewlist_fillpage");
  return;
}

Assistant:

static void garray_arrayviewlist_fillpage(t_garray *x,
                                   t_float fPage,
                                   t_float fTopItem)
{
    int i, size=0, topItem=(int)fTopItem;
    int pagesize=ARRAYPAGESIZE, page=(int)fPage, maxpage;
    int offset, length;
    t_word *data=0;

    if(!garray_getfloatwords(x, &size, &data)) {
        pd_error(x, "error in %s()", __FUNCTION__);
        return;
    }

        /* make sure the requested page is within range */
    maxpage = (size - 1) / pagesize;
    if(page > maxpage)
        page = maxpage;
    if(page < 0)
        page = 0;

    pdgui_vmess("::dialog_array::listview_setpage", "s iii",
        x->x_realname->s_name,
        page, maxpage+1, pagesize);

    offset = page*pagesize;
    length = ((offset+pagesize) > size)?size-offset:pagesize;

    pdgui_vmess("::dialog_array::listview_setdata", "siw",
             x->x_realname->s_name,
             offset,
             length, data + offset);

    pdgui_vmess("::dialog_array::listview_focus", "si",
             x->x_realname->s_name,
             topItem);
}